

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicBuffer.h
# Opt level: O2

string * __thiscall
aeron::concurrent::AtomicBuffer::getStringWithoutLength_abi_cxx11_
          (string *__return_storage_ptr__,AtomicBuffer *this,index_t offset,size_t length)

{
  uint8_t *puVar1;
  
  boundsCheck(this,offset,length);
  puVar1 = this->m_buffer;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<unsigned_char*>
            ((string *)__return_storage_ptr__,puVar1 + offset,puVar1 + offset + length);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getStringWithoutLength(util::index_t offset, size_t length) const
    {
        boundsCheck(offset, length);
        return std::string(m_buffer + offset, m_buffer + offset + length);
    }